

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
           *this,int num_digits,string_view prefix,basic_format_specs<char> *spec,bin_writer<3> f)

{
  alignment aVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  align_spec as;
  align_spec local_50;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>::int_writer<int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  local_40;
  
  local_40.prefix.size_ = prefix.size_;
  local_40.prefix.data_ = prefix.data_;
  uVar4 = (uint)num_digits + local_40.prefix.size_;
  local_40.fill = (char_type)(spec->super_align_spec).fill_;
  aVar1 = (spec->super_align_spec).align_;
  if (aVar1 == ALIGN_NUMERIC) {
    uVar3 = (ulong)(spec->super_align_spec).width_;
    local_40.size_ = uVar3;
    if (uVar3 < uVar4) {
      local_40.size_ = uVar4;
    }
    local_40.padding = 0;
    if (uVar4 <= uVar3) {
      local_40.padding = uVar3 - uVar4;
    }
  }
  else {
    uVar2 = (spec->super_core_format_specs).precision;
    if (num_digits < (int)uVar2) {
      local_40.fill = '0';
      local_40.padding = (ulong)(uVar2 - num_digits);
      local_40.size_ = uVar2 + local_40.prefix.size_;
    }
    else {
      local_40.padding = 0;
      local_40.size_ = uVar4;
    }
  }
  local_50.align_ = (spec->super_align_spec).align_;
  local_50.width_ = (spec->super_align_spec).width_;
  local_50.fill_ = (spec->super_align_spec).fill_;
  if (aVar1 == ALIGN_DEFAULT) {
    local_50.align_ = ALIGN_RIGHT;
  }
  local_40.f = f;
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
            (this,&local_50,&local_40);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + internal::to_unsigned(num_digits);
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision > num_digits) {
      size = prefix.size() + internal::to_unsigned(spec.precision);
      padding = internal::to_unsigned(spec.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(as, padded_int_writer<F>{size, prefix, fill, padding, f});
  }